

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall CodeGenGenericContext::InvalidateState(CodeGenGenericContext *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar4;
  
  auVar1 = _DAT_00364380;
  lVar2 = 0x78;
  auVar3 = _DAT_00365650;
  auVar5 = _DAT_00364370;
  do {
    auVar6 = auVar5 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7fffffef) {
      *(undefined4 *)((long)this->genReg + lVar2 + -0x78) = 0;
      *(undefined4 *)((long)this->genReg + lVar2 + -0x58) = 0;
    }
    auVar6 = auVar3 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7fffffef) {
      *(undefined4 *)((long)this->genReg + lVar2 + -0x38) = 0;
      *(undefined4 *)((long)this->genReg + lVar2 + -0x18) = 0;
    }
    lVar4 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 4;
    auVar5._8_8_ = lVar4 + 4;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 4;
    auVar3._8_8_ = lVar4 + 4;
    lVar2 = lVar2 + 0x80;
  } while (lVar2 != 0x2f8);
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&this->xmmReg[0].type + lVar2) = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x200);
  lVar2 = 0;
  do {
    *(undefined4 *)((long)&this->memCache[0].address.type + lVar2) = 0;
    *(undefined4 *)((long)&this->memCache[0].value.type + lVar2) = 0;
    lVar2 = lVar2 + 0x48;
  } while (lVar2 != 0x480);
  this->memCacheNextSlot = 0;
  this->memCacheFreeSlotCount = 0;
  this->currFreeXmmReg = rXMM0;
  this->currFreeReg = 0;
  return;
}

Assistant:

void CodeGenGenericContext::InvalidateState()
{
#if defined(NULLC_OPTIMIZE_X86)
	for(unsigned i = 0; i < rRegCount; i++)
		genReg[i].type = x86Argument::argNone;

	for(unsigned i = 0; i < rXmmRegCount; i++)
		xmmReg[i].type = x86Argument::argNone;

	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		memCache[i].address.type = x86Argument::argNone;
		memCache[i].value.type = x86Argument::argNone;
	}

	memCacheFreeSlotCount = 0;
	memCacheNextSlot = 0;
#endif

	currFreeXmmReg = rXMM0;
	currFreeReg = 0;
}